

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_cache.hpp
# Opt level: O1

bool __thiscall
cappuccino::
fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert_update(fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                   *this,unsigned_long *key,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,allow a)

{
  __node_base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  
  p_Var2 = (_Hash_node_base *)0x0;
  p_Var1 = std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->m_keyed_elements)._M_h,
                      *key % (this->m_keyed_elements)._M_h._M_bucket_count,key,*key);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var2 = p_Var1->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    if ((a & insert) == 0) {
      return false;
    }
    do_insert(this,key,value);
  }
  else {
    if ((a & update) == 0) {
      return false;
    }
    std::__cxx11::string::operator=((string *)(p_Var2[2]._M_nxt + 4),(string *)value);
  }
  return true;
}

Assistant:

auto do_insert_update(const key_type& key, value_type&& value, allow a) -> bool
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            if (update_allowed(a))
            {
                do_update(keyed_position, std::move(value));
                return true;
            }
        }
        else
        {
            if (insert_allowed(a))
            {
                do_insert(key, std::move(value));
                return true;
            }
        }

        return false;
    }